

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  sqlite3 *db_00;
  int iVar2;
  char *zName;
  int local_4c;
  Expr *pEStack_48;
  int i;
  Expr *pNext;
  char *zColl;
  int j;
  int op;
  Expr *p;
  CollSeq *pColl;
  sqlite3 *db;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  p = (Expr *)0x0;
  _j = pExpr;
LAB_0020c31b:
  do {
    if (_j == (Expr *)0x0) {
LAB_0020c4fc:
      iVar2 = sqlite3CheckCollSeq(pParse,(CollSeq *)p);
      if (iVar2 != 0) {
        p = (Expr *)0x0;
      }
      return (CollSeq *)p;
    }
    uVar1 = _j->op;
    if (uVar1 == 0xb0) {
      uVar1 = _j->op2;
    }
    if (((uVar1 == 0xa9) || (uVar1 == 0xa7)) || (uVar1 == 'M')) {
      if (-1 < _j->iColumn) {
        zName = sqlite3ColumnColl(((_j->y).pTab)->aCol + (int)_j->iColumn);
        p = (Expr *)sqlite3FindCollSeq(db_00,db_00->enc,zName,0);
      }
      goto LAB_0020c4fc;
    }
    if ((uVar1 != '$') && (uVar1 != 0xae)) {
      if (uVar1 == 0xb1) {
        _j = ((_j->x).pList)->a[0].pExpr;
      }
      else {
        if (uVar1 == 'q') {
          p = (Expr *)sqlite3GetCollSeq(pParse,db_00->enc,(CollSeq *)0x0,(_j->u).zToken);
          goto LAB_0020c4fc;
        }
        if ((_j->flags & 0x200) == 0) goto LAB_0020c4fc;
        if ((_j->pLeft == (Expr *)0x0) || ((_j->pLeft->flags & 0x200) == 0)) {
          pEStack_48 = _j->pRight;
          if (((_j->x).pList != (ExprList *)0x0) && (db_00->mallocFailed == '\0')) {
            for (local_4c = 0; local_4c < ((_j->x).pList)->nExpr; local_4c = local_4c + 1) {
              if (((((_j->x).pList)->a[local_4c].pExpr)->flags & 0x200) != 0) {
                pEStack_48 = ((_j->x).pList)->a[local_4c].pExpr;
                break;
              }
            }
          }
          _j = pEStack_48;
        }
        else {
          _j = _j->pLeft;
        }
      }
      goto LAB_0020c31b;
    }
    _j = _j->pLeft;
  } while( true );
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, const Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  const Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( op==TK_REGISTER ) op = p->op2;
    if( op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER ){
      int j;
      assert( ExprUseYTab(p) );
      assert( p->y.pTab!=0 );
      if( (j = p->iColumn)>=0 ){
        const char *zColl = sqlite3ColumnColl(&p->y.pTab->aCol[j]);
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(p) );
      p = p->x.pList->a[0].pExpr;
      continue;
    }
    if( op==TK_COLLATE ){
      assert( !ExprHasProperty(p, EP_IntValue) );
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( ExprUseXList(p) );
        assert( p->x.pList==0 || p->pRight==0 );
        if( p->x.pList!=0 && !db->mallocFailed ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){
    pColl = 0;
  }
  return pColl;
}